

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memvar_propagation.hpp
# Opt level: O0

void __thiscall
optimization::memvar_propagation::Memory_Var_Propagation::optimize_func
          (Memory_Var_Propagation *this,MirFunction *func)

{
  bool bVar1;
  long lVar2;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *other;
  reference pvVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  char *pcVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  pointer ppVar11;
  value_type *pvVar12;
  uint extraout_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  uint extraout_EDX_00;
  int __c_04;
  int __c_05;
  int __c_06;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c_07;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar13;
  int __c_08;
  int __c_09;
  int __c_10;
  int __c_11;
  uint extraout_EDX_05;
  int __c_12;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  variant<int,_mir::inst::VarId> *__s;
  _Self *p_Var14;
  pointer_____offset_0x10___ *ppuVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>,_bool>
  pVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_bool> pVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  iterator lit_15;
  int j_3;
  PhiInst *x_16;
  iterator lit_13;
  iterator lit_14;
  PtrOffsetInst *x_15;
  iterator lit_12;
  StoreInst *x_14;
  iterator lit_11;
  LoadInst *x_13;
  iterator lit_10;
  iterator lit_9;
  OpInst *x_12;
  iterator lit_8;
  int j_2;
  CallInst *x_11;
  iterator lit_7;
  AssignInst *x_10;
  Inst *i_4;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_3;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3_1;
  BasicBlk *bb_1;
  iterator iet1;
  iterator iet;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  iter_1;
  int i_3;
  iterator lit_6;
  PtrOffsetInst *x_9;
  iterator lit_5;
  StoreInst *x_8;
  iterator lit_4;
  LoadInst *x_7;
  iterator lit_3;
  iterator lit_2;
  OpInst *x_6;
  iterator lit_1;
  int j_1;
  CallInst *x_5;
  iterator lit;
  AssignInst *x_4;
  Inst *i_2;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range4_1;
  iterator iet_1;
  variant<int,_mir::inst::VarId> value_1;
  iterator iter;
  LoadInst *x_3;
  variant<int,_mir::inst::VarId> value;
  StoreInst *x_2;
  Inst *i_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range4;
  iterator it;
  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  load;
  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  store;
  int upper_bound;
  int j;
  vector<int,_std::allocator<int>_> del_index;
  StoreInst *x_1;
  iterator find;
  CallInst *x;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range3;
  vector<int,_std::allocator<int>_> call_index;
  int index;
  BasicBlk *bb;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  reg_load;
  iterator bit;
  VarId *in_stack_fffffffffffff608;
  iterator in_stack_fffffffffffff610;
  value_type *in_stack_fffffffffffff618;
  pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_> *in_stack_fffffffffffff620;
  const_iterator in_stack_fffffffffffff628;
  key_type *in_stack_fffffffffffff648;
  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
  *in_stack_fffffffffffff650;
  long local_988;
  long local_960;
  long local_920;
  long local_8f0;
  long local_8c8;
  long local_858;
  long local_818;
  long local_7d8;
  long local_768;
  long local_720;
  long local_6e0;
  long local_628;
  long local_5e8;
  value_type local_5d0;
  long local_5b8;
  long local_5a0;
  _Self local_578;
  _Self local_570;
  int local_564;
  long local_560;
  _Self local_558;
  _Self local_550;
  _Self local_548;
  _Self local_540;
  long local_538;
  _Self local_530;
  _Self local_528;
  long local_520;
  _Self local_518;
  _Self local_510;
  long local_508;
  _Self local_500;
  _Self local_4f8;
  undefined1 local_4f0 [8];
  _Self local_4e8;
  long local_4e0;
  _Self local_4d8;
  _Self local_4d0;
  int local_4c4;
  long local_4c0;
  _Self local_4b8;
  _Self local_4b0;
  long local_4a8;
  type local_4a0;
  reference local_498;
  undefined1 local_490 [8];
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_488;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_480;
  BasicBlk *local_478;
  _Self local_470;
  _Base_ptr local_468;
  _Base_ptr local_460;
  _Base_ptr local_458;
  _Self local_450;
  _Base_ptr local_448;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> local_440;
  _Self local_438;
  _Base_ptr local_430;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> local_428;
  _Base_ptr local_420;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_418;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_408;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_400;
  int local_3f4;
  _Self local_3f0;
  _Self local_3e8;
  long local_3e0;
  _Self local_3d8;
  _Self local_3d0;
  long local_3c8;
  _Self local_3c0;
  _Self local_3b8;
  long local_3b0;
  _Self local_3a8;
  _Self local_3a0;
  undefined1 local_398 [8];
  _Self local_390;
  long local_388;
  _Self local_380;
  _Self local_378;
  int local_36c;
  long local_368;
  _Self local_360;
  _Self local_358;
  long local_350;
  type local_348;
  reference local_340;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_338;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_330;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_328;
  _Base_ptr local_320;
  _Base_ptr local_318;
  _Self local_310;
  _Base_ptr local_308;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
  local_300;
  _Self local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  _Base_ptr local_298;
  undefined1 local_290;
  variant<int,_mir::inst::VarId> local_288;
  _Base_ptr local_268;
  undefined1 local_260;
  variant<int,_mir::inst::VarId> local_258;
  _Self local_230;
  _Base_ptr local_228;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
  local_220;
  _Self local_218;
  _Base_ptr local_210;
  long local_208;
  _Base_ptr local_200;
  undefined1 local_1f8;
  _Self local_1c8;
  _Base_ptr local_1c0;
  long local_1a0;
  type local_198;
  reference local_190;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_188;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_180;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_178;
  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
  local_170 [13];
  value_type local_108;
  int local_104;
  vector<int,_std::allocator<int>_> local_100;
  long local_e8;
  int local_dc;
  _Self local_d8;
  _Self local_d0;
  long local_c8;
  type local_c0;
  reference local_b8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_b0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_a8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_a0;
  undefined4 local_84;
  vector<int,_std::allocator<int>_> local_80;
  int local_64;
  BasicBlk *local_60;
  _Self local_58;
  _Base_ptr local_50;
  _Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> local_18 [3];
  
  std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::_Rb_tree_iterator(local_18);
  std::
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::map((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
         *)0x18db21);
  local_50 = (_Base_ptr)
             std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffff608);
  local_18[0]._M_node = local_50;
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff608);
    bVar1 = std::operator!=(local_18,&local_58);
    if (!bVar1) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x18db8e);
    local_60 = &ppVar6->second;
    local_64 = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18dbba);
    local_84 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff610._M_node,
               (value_type_conflict3 *)in_stack_fffffffffffff608);
    local_a0 = &local_60->inst;
    local_a8._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffff608);
    local_b0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffff608);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff610._M_node,
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff608), bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_a8);
      local_c0 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffff610._M_node);
      if (local_c0 == (type)0x0) {
        local_5a0 = 0;
      }
      else {
        local_5a0 = __dynamic_cast(local_c0,&mir::inst::Inst::typeinfo,
                                   &mir::inst::CallInst::typeinfo,0);
      }
      local_c8 = local_5a0;
      if (local_5a0 != 0) {
        local_d0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff618,in_stack_fffffffffffff610._M_node);
        local_d8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff608);
        bVar1 = std::operator==(&local_d0,&local_d8);
        if (bVar1) {
          local_dc = local_64 + 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff610._M_node,
                     (value_type_conflict3 *)in_stack_fffffffffffff608);
        }
      }
      if (local_c0 == (type)0x0) {
        local_5b8 = 0;
      }
      else {
        local_5b8 = __dynamic_cast(local_c0,&mir::inst::Inst::typeinfo,
                                   &mir::inst::StoreInst::typeinfo,0);
      }
      local_e8 = local_5b8;
      if (local_5b8 != 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
                   (value_type_conflict3 *)in_stack_fffffffffffff618);
      }
      local_64 = local_64 + 1;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_a8);
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18de2a);
    for (local_104 = 0; uVar8 = (ulong)local_104,
        sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_80), uVar8 < sVar9;
        local_104 = local_104 + 1) {
      lVar2 = (long)local_104;
      sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_80);
      if (lVar2 == sVar9 - 1) {
        sVar9 = std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::size(&local_60->inst);
        local_5d0 = (value_type)sVar9;
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(long)(local_104 + 1))
        ;
        local_5d0 = *pvVar3;
      }
      local_108 = local_5d0;
      std::
      map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
      ::map((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
             *)0x18def3);
      std::
      map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
      ::map((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
             *)0x18df00);
      std::
      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>::
      _Rb_tree_iterator(local_170);
      local_64 = 0;
      local_178 = &local_60->inst;
      local_180._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffff608);
      local_188 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffff608);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff610._M_node,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff608), bVar1) {
        local_190 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    ::operator*(&local_180);
        iVar13 = local_64;
        ppuVar15 = (pointer_____offset_0x10___ *)(long)local_104;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(size_type)ppuVar15);
        if ((*pvVar3 <= iVar13) && (local_64 < local_108)) {
          local_198 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                      operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)in_stack_fffffffffffff610._M_node);
          if (local_198 == (type)0x0) {
            auVar18._4_8_ = 0;
            auVar18._0_4_ = extraout_EDX;
            auVar18 = auVar18 << 0x40;
          }
          else {
            ppuVar15 = &mir::inst::Inst::typeinfo;
            auVar18 = __dynamic_cast(local_198,&mir::inst::Inst::typeinfo,
                                     &mir::inst::StoreInst::typeinfo,0);
          }
          local_5e8 = auVar18._0_8_;
          local_1a0 = local_5e8;
          if (local_5e8 == 0) {
            if (local_198 == (type)0x0) {
              auVar19._4_8_ = 0;
              auVar19._0_4_ = auVar18._8_4_;
              auVar19 = auVar19 << 0x40;
            }
            else {
              ppuVar15 = &mir::inst::Inst::typeinfo;
              auVar19 = __dynamic_cast(local_198,&mir::inst::Inst::typeinfo,
                                       &mir::inst::LoadInst::typeinfo,0);
            }
            local_628 = auVar19._0_8_;
            local_208 = local_628;
            if ((local_628 != 0) &&
               (pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)(local_628 + 0x20),
                                    (char *)ppuVar15,auVar19._8_4_), pcVar7 == (char *)0x1)) {
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e2cb);
              local_210 = (_Base_ptr)
                          std::
                          map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                          ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                  *)in_stack_fffffffffffff608,(key_type *)0x18e2ea);
              local_170[0]._M_node = local_210;
              local_218._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                   ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                          *)in_stack_fffffffffffff608);
              bVar1 = std::operator!=(local_170,&local_218);
              if (bVar1) {
                std::
                _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                ::_Rb_tree_iterator(&local_220);
                local_228 = (_Base_ptr)
                            std::
                            map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                            ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                    *)in_stack_fffffffffffff608,(key_type *)0x18e36d);
                local_220._M_node = local_228;
                local_230._M_node =
                     (_Base_ptr)
                     std::
                     map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                     ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                            *)in_stack_fffffffffffff608);
                bVar1 = std::operator==(&local_220,&local_230);
                if (bVar1) {
                  std::
                  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                *)0x18e3eb);
                  std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>::
                  pair<mir::inst::VarId_&,_std::variant<int,_mir::inst::VarId>_&,_true>
                            (in_stack_fffffffffffff620,&in_stack_fffffffffffff618->first,
                             (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node);
                  __s = &local_258;
                  pVar16 = std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::insert((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                     *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
                  local_268 = (_Base_ptr)pVar16.first._M_node;
                  local_260 = pVar16.second;
                  ppVar4 = std::
                           _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                           ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                         *)0x18e45a);
                  pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                     (&ppVar4->second,(char *)__s,__c_00);
                  if (pcVar7 == (char *)0x1) {
                    std::
                    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                    ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                  *)0x18e491);
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e49d);
                    std::pair<const_mir::inst::VarId,_mir::inst::VarId>::
                    pair<mir::inst::VarId_&,_mir::inst::VarId_&,_true>
                              ((pair<const_mir::inst::VarId,_mir::inst::VarId> *)
                               in_stack_fffffffffffff620,&in_stack_fffffffffffff618->first,
                               (VarId *)in_stack_fffffffffffff610._M_node);
                    __s = &local_288;
                    pVar17 = std::
                             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                             ::insert((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                       *)in_stack_fffffffffffff620,
                                      (value_type *)in_stack_fffffffffffff618);
                    local_298 = (_Base_ptr)pVar17.first._M_node;
                    local_290 = pVar17.second;
                  }
                }
                else {
                  ppVar4 = std::
                           _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                           ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                         *)0x18e519);
                  __s = &ppVar4->second;
                  std::
                  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                  ::operator[](in_stack_fffffffffffff650,in_stack_fffffffffffff648);
                  std::variant<int,_mir::inst::VarId>::operator=
                            ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                             (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff608);
                }
                ppVar4 = std::
                         _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                       *)0x18e56e);
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   (&ppVar4->second,(char *)__s,__c_01);
                if (pcVar7 == (char *)0x1) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620,
                             (value_type_conflict3 *)in_stack_fffffffffffff618);
                }
              }
              else {
                std::variant<int,_mir::inst::VarId>::variant
                          ((variant<int,_mir::inst::VarId> *)0x18e5b3);
                pcVar7 = (char *)(local_208 + 8);
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                          ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                           in_stack_fffffffffffff608);
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)(local_208 + 0x20),pcVar7,
                                    __c_02);
                if (pcVar7 == (char *)0x1) {
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e5fa);
                  std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>::
                  pair<mir::inst::VarId_&,_std::variant<int,_mir::inst::VarId>_&,_true>
                            (in_stack_fffffffffffff620,&in_stack_fffffffffffff618->first,
                             (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node);
                  pVar16 = std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::insert((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                     *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
                  local_2e8 = (_Base_ptr)pVar16.first._M_node;
                  local_2e0 = pVar16.second;
                }
              }
            }
          }
          else {
            std::variant<int,_mir::inst::VarId>::variant((variant<int,_mir::inst::VarId> *)0x18e05e)
            ;
            pcVar7 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)(local_1a0 + 0x20),
                                (char *)ppuVar15,__c);
            if (pcVar7 == (char *)0x1) {
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e08a);
              std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                        ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                         in_stack_fffffffffffff608);
            }
            else {
              std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e0f1);
              std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                        ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                         (int *)in_stack_fffffffffffff608);
            }
            local_1c0 = (_Base_ptr)
                        std::
                        map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                        ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                *)in_stack_fffffffffffff608,(key_type *)0x18e12d);
            local_170[0]._M_node = local_1c0;
            local_1c8._M_node =
                 (_Base_ptr)
                 std::
                 map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                 ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                        *)in_stack_fffffffffffff608);
            bVar1 = std::operator==(local_170,&local_1c8);
            if (bVar1) {
              std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>::
              pair<mir::inst::VarId_&,_std::variant<int,_mir::inst::VarId>_&,_true>
                        (in_stack_fffffffffffff620,&in_stack_fffffffffffff618->first,
                         (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node);
              pVar16 = std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::insert((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                 *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
              local_200 = (_Base_ptr)pVar16.first._M_node;
              local_1f8 = pVar16.second;
            }
            else {
              std::
              map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
              ::operator[](in_stack_fffffffffffff650,in_stack_fffffffffffff648);
              std::variant<int,_mir::inst::VarId>::operator=
                        ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                         (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff608);
            }
          }
        }
        local_64 = local_64 + 1;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_180);
      }
      local_2f0 = (_Base_ptr)
                  std::
                  map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                  ::begin((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           *)in_stack_fffffffffffff608);
      local_170[0]._M_node = local_2f0;
      while( true ) {
        local_2f8._M_node =
             (_Base_ptr)
             std::
             map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
             ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                    *)in_stack_fffffffffffff608);
        bVar1 = std::operator!=(local_170,&local_2f8);
        if (!bVar1) break;
        std::
        _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
        ::_Rb_tree_iterator(&local_300);
        local_308 = (_Base_ptr)
                    std::
                    map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                    ::begin((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                             *)in_stack_fffffffffffff608);
        local_300._M_node = local_308;
        while( true ) {
          local_310._M_node =
               (_Base_ptr)
               std::
               map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
               ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                      *)in_stack_fffffffffffff608);
          p_Var14 = &local_310;
          bVar1 = std::operator!=(&local_300,p_Var14);
          if (!bVar1) break;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                 *)0x18e75e);
          pcVar7 = std::variant<int,_mir::inst::VarId>::index
                             (&ppVar4->second,(char *)p_Var14,__c_03);
          if (pcVar7 == (char *)0x1) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                   *)0x18e781);
            std::
            _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                          *)0x18e796);
            other = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e7a2);
            bVar1 = mir::inst::VarId::operator==(&ppVar4->first,other);
            if (bVar1) {
              std::
              _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                            *)0x18e7d4);
              std::
              _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                            *)0x18e7ed);
              std::
              map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
              ::operator[](in_stack_fffffffffffff650,in_stack_fffffffffffff648);
              std::variant<int,_mir::inst::VarId>::operator=
                        ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                         (variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff608);
            }
          }
          local_318 = (_Base_ptr)
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)in_stack_fffffffffffff618,
                                   (int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
        }
        local_320 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                    ::operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                  *)in_stack_fffffffffffff618,
                                 (int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
      }
      local_64 = 0;
      local_328 = &local_60->inst;
      local_330._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    *)in_stack_fffffffffffff608);
      local_338 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         *)in_stack_fffffffffffff608);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff610._M_node,
                                (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                                 *)in_stack_fffffffffffff608), bVar1) {
        local_340 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                    ::operator*(&local_330);
        iVar13 = local_64;
        ppuVar15 = (pointer_____offset_0x10___ *)(long)local_104;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,(size_type)ppuVar15);
        if ((*pvVar3 <= iVar13) && (local_64 < local_108)) {
          local_348 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::
                      operator*((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                 *)in_stack_fffffffffffff610._M_node);
          if (local_348 == (type)0x0) {
            auVar20._4_8_ = 0;
            auVar20._0_4_ = extraout_EDX_00;
            auVar20 = auVar20 << 0x40;
          }
          else {
            ppuVar15 = &mir::inst::Inst::typeinfo;
            auVar20 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                     &mir::inst::AssignInst::typeinfo,0);
          }
          local_6e0 = auVar20._0_8_;
          local_350 = local_6e0;
          if (local_6e0 == 0) {
            if (local_348 == (type)0x0) {
              auVar21._4_8_ = 0;
              auVar21._0_4_ = auVar20._8_4_;
              auVar21 = auVar21 << 0x40;
            }
            else {
              ppuVar15 = &mir::inst::Inst::typeinfo;
              auVar21 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                       &mir::inst::CallInst::typeinfo,0);
            }
            local_720 = auVar21._0_8_;
            local_368 = local_720;
            if (local_720 == 0) {
              if (local_348 == (type)0x0) {
                auVar22._4_8_ = 0;
                auVar22._0_4_ = auVar21._8_4_;
                auVar22 = auVar22 << 0x40;
              }
              else {
                ppuVar15 = &mir::inst::Inst::typeinfo;
                auVar22 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                         &mir::inst::OpInst::typeinfo,0);
              }
              local_768 = auVar22._0_8_;
              local_388 = local_768;
              if (local_768 == 0) {
                if (local_348 == (type)0x0) {
                  auVar23._4_8_ = 0;
                  auVar23._0_4_ = auVar22._8_4_;
                  auVar23 = auVar23 << 0x40;
                }
                else {
                  ppuVar15 = &mir::inst::Inst::typeinfo;
                  auVar23 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                           &mir::inst::LoadInst::typeinfo,0);
                }
                local_7d8 = auVar23._0_8_;
                local_3b0 = local_7d8;
                if (local_7d8 == 0) {
                  if (local_348 == (type)0x0) {
                    auVar24._4_8_ = 0;
                    auVar24._0_4_ = auVar23._8_4_;
                    auVar24 = auVar24 << 0x40;
                  }
                  else {
                    ppuVar15 = &mir::inst::Inst::typeinfo;
                    auVar24 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                             &mir::inst::StoreInst::typeinfo,0);
                  }
                  local_818 = auVar24._0_8_;
                  local_3c8 = local_818;
                  if (local_818 == 0) {
                    if (local_348 == (type)0x0) {
                      auVar25._4_8_ = 0;
                      auVar25._0_4_ = auVar24._8_4_;
                      auVar25 = auVar25 << 0x40;
                    }
                    else {
                      ppuVar15 = &mir::inst::Inst::typeinfo;
                      auVar25 = __dynamic_cast(local_348,&mir::inst::Inst::typeinfo,
                                               &mir::inst::PtrOffsetInst::typeinfo,0);
                    }
                    local_858 = auVar25._0_8_;
                    local_3e0 = local_858;
                    if ((local_858 != 0) &&
                       (pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                           ((variant<int,_mir::inst::VarId> *)(local_858 + 0x30),
                                            (char *)ppuVar15,auVar25._8_4_), pcVar7 == (char *)0x1))
                    {
                      std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18f4d3)
                      ;
                      local_3e8._M_node =
                           (_Base_ptr)
                           std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                   *)in_stack_fffffffffffff608,(key_type *)0x18f4f2);
                      local_3f0._M_node =
                           (_Base_ptr)
                           std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                  *)in_stack_fffffffffffff608);
                      p_Var14 = &local_3f0;
                      bVar1 = std::operator!=(&local_3e8,p_Var14);
                      if (bVar1) {
                        ppVar4 = std::
                                 _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                 ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                               *)0x18f54c);
                        pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                           (&ppVar4->second,(char *)p_Var14,__c_11);
                        if (pcVar7 == (char *)0x0) {
                          std::
                          _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                        *)0x18f57f);
                          std::get<0ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x18f58b);
                          std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                    ((variant<int,_mir::inst::VarId> *)
                                     in_stack_fffffffffffff610._M_node,
                                     (int *)in_stack_fffffffffffff608);
                        }
                        else {
                          std::
                          _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                        *)0x18f5cf);
                          std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x18f5db);
                          std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                    ((variant<int,_mir::inst::VarId> *)
                                     in_stack_fffffffffffff610._M_node,in_stack_fffffffffffff608);
                        }
                      }
                    }
                  }
                  else {
                    pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                       ((variant<int,_mir::inst::VarId> *)(local_818 + 0x20),
                                        (char *)ppuVar15,auVar24._8_4_);
                    if (pcVar7 == (char *)0x1) {
                      std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18f305)
                      ;
                      local_3d0._M_node =
                           (_Base_ptr)
                           std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                   *)in_stack_fffffffffffff608,(key_type *)0x18f324);
                      local_3d8._M_node =
                           (_Base_ptr)
                           std::
                           map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                  *)in_stack_fffffffffffff608);
                      p_Var14 = &local_3d8;
                      bVar1 = std::operator!=(&local_3d0,p_Var14);
                      if (bVar1) {
                        ppVar4 = std::
                                 _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                 ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                               *)0x18f37e);
                        pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                           (&ppVar4->second,(char *)p_Var14,__c_10);
                        if (pcVar7 == (char *)0x0) {
                          std::
                          _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                        *)0x18f3b1);
                          std::get<0ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x18f3bd);
                          std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                    ((variant<int,_mir::inst::VarId> *)
                                     in_stack_fffffffffffff610._M_node,
                                     (int *)in_stack_fffffffffffff608);
                        }
                        else {
                          std::
                          _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                        *)0x18f401);
                          std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)0x18f40d);
                          std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                    ((variant<int,_mir::inst::VarId> *)
                                     in_stack_fffffffffffff610._M_node,in_stack_fffffffffffff608);
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                     ((variant<int,_mir::inst::VarId> *)(local_7d8 + 0x20),
                                      (char *)ppuVar15,auVar23._8_4_);
                  if (pcVar7 == (char *)0x1) {
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18f137);
                    local_3b8._M_node =
                         (_Base_ptr)
                         std::
                         map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                         ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                 *)in_stack_fffffffffffff608,(key_type *)0x18f156);
                    local_3c0._M_node =
                         (_Base_ptr)
                         std::
                         map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                         ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                *)in_stack_fffffffffffff608);
                    p_Var14 = &local_3c0;
                    bVar1 = std::operator!=(&local_3b8,p_Var14);
                    if (bVar1) {
                      ppVar4 = std::
                               _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                               ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                             *)0x18f1b0);
                      pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                         (&ppVar4->second,(char *)p_Var14,__c_09);
                      if (pcVar7 == (char *)0x0) {
                        std::
                        _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                      *)0x18f1e3);
                        std::get<0ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x18f1ef);
                        std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                  ((variant<int,_mir::inst::VarId> *)
                                   in_stack_fffffffffffff610._M_node,
                                   (int *)in_stack_fffffffffffff608);
                      }
                      else {
                        std::
                        _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                        ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                      *)0x18f233);
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)0x18f23f);
                        std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                  ((variant<int,_mir::inst::VarId> *)
                                   in_stack_fffffffffffff610._M_node,in_stack_fffffffffffff608);
                      }
                    }
                  }
                }
              }
              else {
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)(local_768 + 0x20),
                                    (char *)ppuVar15,auVar22._8_4_);
                iVar13 = extraout_EDX_01;
                if (pcVar7 == (char *)0x1) {
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ee0a);
                  local_390._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                               *)in_stack_fffffffffffff608,(key_type *)0x18ee29);
                  local_398 = (undefined1  [8])
                              std::
                              map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                              ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                                     *)in_stack_fffffffffffff608);
                  ppuVar15 = (pointer_____offset_0x10___ *)local_398;
                  bVar1 = std::operator!=(&local_390,(_Self *)ppuVar15);
                  iVar13 = extraout_EDX_02;
                  if (bVar1) {
                    ppVar4 = std::
                             _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                           *)0x18ee83);
                    pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                       (&ppVar4->second,(char *)ppuVar15,__c_07);
                    if (pcVar7 == (char *)0x0) {
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18eeb6);
                      ppuVar15 = (pointer_____offset_0x10___ *)
                                 std::get<0ul,int,mir::inst::VarId>
                                           ((variant<int,_mir::inst::VarId> *)0x18eec2);
                      std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,(int *)in_stack_fffffffffffff608);
                      iVar13 = extraout_EDX_03;
                    }
                    else {
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18ef06);
                      ppuVar15 = (pointer_____offset_0x10___ *)
                                 std::get<1ul,int,mir::inst::VarId>
                                           ((variant<int,_mir::inst::VarId> *)0x18ef12);
                      std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,in_stack_fffffffffffff608);
                      iVar13 = extraout_EDX_04;
                    }
                  }
                }
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)(local_388 + 0x40),
                                    (char *)ppuVar15,iVar13);
                if (pcVar7 == (char *)0x1) {
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ef69);
                  local_3a0._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                               *)in_stack_fffffffffffff608,(key_type *)0x18ef88);
                  local_3a8._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                              *)in_stack_fffffffffffff608);
                  p_Var14 = &local_3a8;
                  bVar1 = std::operator!=(&local_3a0,p_Var14);
                  if (bVar1) {
                    ppVar4 = std::
                             _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                           *)0x18efe2);
                    pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                       (&ppVar4->second,(char *)p_Var14,__c_08);
                    if (pcVar7 == (char *)0x0) {
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18f015);
                      std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18f021)
                      ;
                      std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,(int *)in_stack_fffffffffffff608);
                    }
                    else {
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18f065);
                      std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18f071)
                      ;
                      std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,in_stack_fffffffffffff608);
                    }
                  }
                }
              }
            }
            else {
              for (local_36c = 0; uVar8 = (ulong)local_36c,
                  sVar9 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                     (local_368 + 0x38)), uVar8 < sVar9; local_36c = local_36c + 1)
              {
                pcVar7 = (char *)(long)local_36c;
                pvVar10 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                          operator[]((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                     (local_368 + 0x38),(size_type)pcVar7);
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)&pvVar10->field_0x8,pcVar7,
                                    __c_05);
                if (pcVar7 == (char *)0x1) {
                  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                             (local_368 + 0x38),(long)local_36c);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ec02);
                  local_378._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                               *)in_stack_fffffffffffff608,(key_type *)0x18ec21);
                  local_380._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                       ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                              *)in_stack_fffffffffffff608);
                  p_Var14 = &local_380;
                  bVar1 = std::operator!=(&local_378,p_Var14);
                  if (bVar1) {
                    ppVar4 = std::
                             _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                             ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                           *)0x18ec7b);
                    pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                       (&ppVar4->second,(char *)p_Var14,__c_06);
                    if (pcVar7 == (char *)0x0) {
                      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                 (local_368 + 0x38),(long)local_36c);
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18ecbf);
                      std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18eccb)
                      ;
                      std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,(int *)in_stack_fffffffffffff608);
                    }
                    else {
                      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                 (local_368 + 0x38),(long)local_36c);
                      std::
                      _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                      ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                    *)0x18ed20);
                      std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ed2c)
                      ;
                      std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,in_stack_fffffffffffff608);
                    }
                  }
                }
              }
            }
          }
          else {
            pcVar7 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)(local_6e0 + 0x20),
                                (char *)ppuVar15,auVar20._8_4_);
            if (pcVar7 == (char *)0x1) {
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18e9d0);
              local_358._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                   ::find((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                           *)in_stack_fffffffffffff608,(key_type *)0x18e9ef);
              local_360._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                   ::end((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
                          *)in_stack_fffffffffffff608);
              p_Var14 = &local_360;
              bVar1 = std::operator!=(&local_358,p_Var14);
              if (bVar1) {
                ppVar4 = std::
                         _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                       *)0x18ea49);
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   (&ppVar4->second,(char *)p_Var14,__c_04);
                if (pcVar7 == (char *)0x0) {
                  std::
                  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                *)0x18ea7c);
                  std::get<0ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ea88);
                  std::variant<int,mir::inst::VarId>::emplace<0ul,int&>
                            ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                             (int *)in_stack_fffffffffffff608);
                }
                else {
                  std::
                  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>
                                *)0x18eacc);
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18ead8);
                  std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                            ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                             in_stack_fffffffffffff608);
                }
              }
            }
          }
        }
        local_64 = local_64 + 1;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
        ::operator++(&local_330);
      }
      std::
      map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
      ::~map((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
              *)0x18f640);
      std::
      map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
      ::~map((map<mir::inst::VarId,_std::variant<int,_mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::variant<int,_mir::inst::VarId>_>_>_>
              *)0x18f64d);
    }
    sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_100);
    local_3f4 = (int)sVar9;
    while (local_3f4 = local_3f4 + -1, -1 < local_3f4) {
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x18f69e);
      local_408 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff608);
      std::vector<int,_std::allocator<int>_>::operator[](&local_100,(long)local_3f4);
      local_400 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator+((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff618,
                              (difference_type)in_stack_fffffffffffff610._M_node);
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x18f6ec);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>const*,std::vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>>
      ::__normal_iterator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>*>
                ((__normal_iterator<const_std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  *)in_stack_fffffffffffff610._M_node,
                 (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  *)in_stack_fffffffffffff608);
      local_418 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           *)in_stack_fffffffffffff620,in_stack_fffffffffffff628);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff620);
    local_420 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                           in_stack_fffffffffffff618,
                           (int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
  }
  std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::_Rb_tree_iterator
            (&local_428);
  local_430 = (_Base_ptr)
              std::
              map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              ::begin((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       *)in_stack_fffffffffffff608);
  local_428._M_node = local_430;
  while( true ) {
    local_438._M_node =
         (_Base_ptr)
         std::
         map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
         ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                *)in_stack_fffffffffffff608);
    bVar1 = std::operator!=(&local_428,&local_438);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::_Rb_tree_iterator
              (&local_440);
    local_448 = (_Base_ptr)
                std::
                map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                ::begin((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                         *)in_stack_fffffffffffff608);
    local_440._M_node = local_448;
    while( true ) {
      local_450._M_node =
           (_Base_ptr)
           std::
           map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
           ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffff608);
      bVar1 = std::operator!=(&local_440,&local_450);
      if (!bVar1) break;
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            *)0x18f894);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
               operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> *
                          )0x18f8a9);
      bVar1 = mir::inst::VarId::operator==(&ppVar11->first,&ppVar5->second);
      if (bVar1) {
        std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> *)
                   0x18f8d0);
        std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> *)
                   0x18f8e9);
        std::
        map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
        ::operator[]((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                      *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        mir::inst::VarId::operator=
                  ((VarId *)in_stack_fffffffffffff610._M_node,in_stack_fffffffffffff608);
      }
      local_458 = (_Base_ptr)
                  std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                  operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                              *)in_stack_fffffffffffff618,
                             (int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
    }
    local_460 = (_Base_ptr)
                std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                operator++((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            *)in_stack_fffffffffffff618,
                           (int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
  }
  local_468 = (_Base_ptr)
              std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                       *)in_stack_fffffffffffff608);
  local_18[0]._M_node = local_468;
  while( true ) {
    local_470._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffff608);
    bVar1 = std::operator!=(local_18,&local_470);
    if (!bVar1) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x18f9dc);
    local_478 = &ppVar6->second;
    local_480 = &(ppVar6->second).inst;
    local_488._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffff608);
    local_490 = (undefined1  [8])
                std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffff608);
    while( true ) {
      ppuVar15 = (pointer_____offset_0x10___ *)local_490;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffff610._M_node,
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_fffffffffffff608);
      if (!bVar1) break;
      local_498 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  ::operator*(&local_488);
      local_4a0 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_fffffffffffff610._M_node);
      if (local_4a0 == (type)0x0) {
        auVar26._4_8_ = 0;
        auVar26._0_4_ = extraout_EDX_05;
        auVar26 = auVar26 << 0x40;
      }
      else {
        ppuVar15 = &mir::inst::Inst::typeinfo;
        auVar26 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                 &mir::inst::AssignInst::typeinfo,0);
      }
      local_8c8 = auVar26._0_8_;
      local_4a8 = local_8c8;
      if (local_8c8 == 0) {
        if (local_4a0 == (type)0x0) {
          auVar27._4_8_ = 0;
          auVar27._0_4_ = auVar26._8_4_;
          auVar27 = auVar27 << 0x40;
        }
        else {
          ppuVar15 = &mir::inst::Inst::typeinfo;
          auVar27 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                   &mir::inst::CallInst::typeinfo,0);
        }
        local_8f0 = auVar27._0_8_;
        local_4c0 = local_8f0;
        if (local_8f0 == 0) {
          if (local_4a0 == (type)0x0) {
            auVar28._4_8_ = 0;
            auVar28._0_4_ = auVar27._8_4_;
            auVar28 = auVar28 << 0x40;
          }
          else {
            ppuVar15 = &mir::inst::Inst::typeinfo;
            auVar28 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                     &mir::inst::OpInst::typeinfo,0);
          }
          local_920 = auVar28._0_8_;
          local_4e0 = local_920;
          if (local_920 == 0) {
            if (local_4a0 == (type)0x0) {
              auVar29._4_8_ = 0;
              auVar29._0_4_ = auVar28._8_4_;
              auVar29 = auVar29 << 0x40;
            }
            else {
              ppuVar15 = &mir::inst::Inst::typeinfo;
              auVar29 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                       &mir::inst::LoadInst::typeinfo,0);
            }
            local_960 = auVar29._0_8_;
            local_508 = local_960;
            if (local_960 == 0) {
              if (local_4a0 == (type)0x0) {
                auVar30._4_8_ = 0;
                auVar30._0_4_ = auVar29._8_4_;
                auVar30 = auVar30 << 0x40;
              }
              else {
                ppuVar15 = &mir::inst::Inst::typeinfo;
                auVar30 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                         &mir::inst::StoreInst::typeinfo,0);
              }
              local_988 = auVar30._0_8_;
              local_520 = local_988;
              if (local_988 == 0) {
                if (local_4a0 == (type)0x0) {
                  auVar31._4_8_ = 0;
                  auVar31._0_4_ = auVar30._8_4_;
                  auVar31 = auVar31 << 0x40;
                }
                else {
                  ppuVar15 = &mir::inst::Inst::typeinfo;
                  auVar31 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                           &mir::inst::PtrOffsetInst::typeinfo,0);
                }
                local_538 = auVar31._0_8_;
                if (local_538 == 0) {
                  if (local_4a0 == (type)0x0) {
                    local_560 = 0;
                  }
                  else {
                    local_560 = __dynamic_cast(local_4a0,&mir::inst::Inst::typeinfo,
                                               &mir::inst::PhiInst::typeinfo,0);
                  }
                  if (local_560 != 0) {
                    local_564 = 0;
                    while( true ) {
                      in_stack_fffffffffffff618 = (value_type *)(long)local_564;
                      pvVar12 = (value_type *)
                                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                                size((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     (local_560 + 0x28));
                      if (pvVar12 <= in_stack_fffffffffffff618) break;
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 (local_560 + 0x28),(long)local_564);
                      in_stack_fffffffffffff610 =
                           std::
                           map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                   *)in_stack_fffffffffffff608,(key_type *)0x19045f);
                      local_570._M_node = in_stack_fffffffffffff610._M_node;
                      local_578._M_node =
                           (_Base_ptr)
                           std::
                           map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                  *)in_stack_fffffffffffff608);
                      bVar1 = std::operator!=(&local_570,&local_578);
                      if (bVar1) {
                        ppVar11 = std::
                                  _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                  ::operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                                *)0x1904b0);
                        in_stack_fffffffffffff608 = &ppVar11->second;
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   (local_560 + 0x28),(long)local_564);
                        mir::inst::VarId::operator=
                                  ((VarId *)in_stack_fffffffffffff610._M_node,
                                   in_stack_fffffffffffff608);
                      }
                      local_564 = local_564 + 1;
                    }
                  }
                }
                else {
                  pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                     ((variant<int,_mir::inst::VarId> *)(local_538 + 0x30),
                                      (char *)ppuVar15,auVar31._8_4_);
                  if (pcVar7 == (char *)0x1) {
                    std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x190288);
                    local_540._M_node =
                         (_Base_ptr)
                         std::
                         map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                         ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                 *)in_stack_fffffffffffff608,(key_type *)0x1902a1);
                    local_548._M_node =
                         (_Base_ptr)
                         std::
                         map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                         ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                *)in_stack_fffffffffffff608);
                    bVar1 = std::operator!=(&local_540,&local_548);
                    if (bVar1) {
                      std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                      operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                  *)0x190303);
                      std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                                ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node
                                 ,in_stack_fffffffffffff608);
                    }
                  }
                  local_550._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                               *)in_stack_fffffffffffff608,(key_type *)0x190333);
                  local_558._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              *)in_stack_fffffffffffff608);
                  bVar1 = std::operator!=(&local_550,&local_558);
                  if (bVar1) {
                    std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                    operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                *)0x190384);
                    mir::inst::VarId::operator=
                              ((VarId *)in_stack_fffffffffffff610._M_node,in_stack_fffffffffffff608)
                    ;
                  }
                }
              }
              else {
                pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                   ((variant<int,_mir::inst::VarId> *)(local_988 + 0x20),
                                    (char *)ppuVar15,auVar30._8_4_);
                if (pcVar7 == (char *)0x1) {
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x190166);
                  local_528._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                               *)in_stack_fffffffffffff608,(key_type *)0x19017f);
                  local_530._M_node =
                       (_Base_ptr)
                       std::
                       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              *)in_stack_fffffffffffff608);
                  bVar1 = std::operator!=(&local_528,&local_530);
                  if (bVar1) {
                    std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                    operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                *)0x1901e1);
                    std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                              ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                               in_stack_fffffffffffff608);
                  }
                }
              }
            }
            else {
              pcVar7 = std::variant<int,_mir::inst::VarId>::index
                                 ((variant<int,_mir::inst::VarId> *)(local_960 + 0x20),
                                  (char *)ppuVar15,auVar29._8_4_);
              if (pcVar7 == (char *)0x1) {
                std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x190032);
                local_510._M_node =
                     (_Base_ptr)
                     std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                             *)in_stack_fffffffffffff608,(key_type *)0x190051);
                local_518._M_node =
                     (_Base_ptr)
                     std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                            *)in_stack_fffffffffffff608);
                bVar1 = std::operator!=(&local_510,&local_518);
                if (bVar1) {
                  std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                  operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                              *)0x1900bc);
                  std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                            ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                             in_stack_fffffffffffff608);
                }
              }
            }
          }
          else {
            pcVar7 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)(local_920 + 0x20),
                                (char *)ppuVar15,auVar28._8_4_);
            iVar13 = extraout_EDX_06;
            if (pcVar7 == (char *)0x1) {
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18fe1b);
              local_4e8._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffff608,(key_type *)0x18fe3a);
              local_4f0 = (undefined1  [8])
                          std::
                          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                                 *)in_stack_fffffffffffff608);
              ppuVar15 = (pointer_____offset_0x10___ *)local_4f0;
              bVar1 = std::operator!=(&local_4e8,(_Self *)ppuVar15);
              iVar13 = extraout_EDX_07;
              if (bVar1) {
                ppVar11 = std::
                          _Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                          operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                      *)0x18fea5);
                ppuVar15 = (pointer_____offset_0x10___ *)&ppVar11->second;
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                          ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                           in_stack_fffffffffffff608);
                iVar13 = extraout_EDX_08;
              }
            }
            pcVar7 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)(local_4e0 + 0x40),
                                (char *)ppuVar15,iVar13);
            if (pcVar7 == (char *)0x1) {
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18feef);
              local_4f8._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffff608,(key_type *)0x18ff0e);
              local_500._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          *)in_stack_fffffffffffff608);
              bVar1 = std::operator!=(&local_4f8,&local_500);
              if (bVar1) {
                std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            *)0x18ff79);
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                          ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                           in_stack_fffffffffffff608);
              }
            }
          }
        }
        else {
          for (local_4c4 = 0; uVar8 = (ulong)local_4c4,
              sVar9 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::size
                                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                 (local_4c0 + 0x38)), uVar8 < sVar9; local_4c4 = local_4c4 + 1) {
            pcVar7 = (char *)(long)local_4c4;
            pvVar10 = std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                                 (local_4c0 + 0x38),(size_type)pcVar7);
            pcVar7 = std::variant<int,_mir::inst::VarId>::index
                               ((variant<int,_mir::inst::VarId> *)&pvVar10->field_0x8,pcVar7,__c_12)
            ;
            if (pcVar7 == (char *)0x1) {
              std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                        ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                         (local_4c0 + 0x38),(long)local_4c4);
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18fcaf);
              local_4d0._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                           *)in_stack_fffffffffffff608,(key_type *)0x18fcce);
              local_4d8._M_node =
                   (_Base_ptr)
                   std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                          *)in_stack_fffffffffffff608);
              bVar1 = std::operator!=(&local_4d0,&local_4d8);
              if (bVar1) {
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::operator[]
                          ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                           (local_4c0 + 0x38),(long)local_4c4);
                std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::
                operator->((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            *)0x18fd4a);
                std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                          ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                           in_stack_fffffffffffff608);
              }
            }
          }
        }
      }
      else {
        pcVar7 = std::variant<int,_mir::inst::VarId>::index
                           ((variant<int,_mir::inst::VarId> *)(local_8c8 + 0x20),(char *)ppuVar15,
                            auVar26._8_4_);
        if (pcVar7 == (char *)0x1) {
          std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x18fb08);
          local_4b0._M_node =
               (_Base_ptr)
               std::
               map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                       *)in_stack_fffffffffffff608,(key_type *)0x18fb27);
          local_4b8._M_node =
               (_Base_ptr)
               std::
               map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                      *)in_stack_fffffffffffff608);
          bVar1 = std::operator!=(&local_4b0,&local_4b8);
          if (bVar1) {
            std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> *)
                       0x18fb92);
            std::variant<int,mir::inst::VarId>::emplace<1ul,mir::inst::VarId&>
                      ((variant<int,_mir::inst::VarId> *)in_stack_fffffffffffff610._M_node,
                       in_stack_fffffffffffff608);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_488);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffff618,(int)((ulong)in_stack_fffffffffffff610._M_node >> 0x20));
  }
  std::
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~map((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          *)0x190542);
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    /*
    store val to s_dest
    l_dest = load src
    if src is the same as s_dest
    l_dest can be repalced by val to
      1. the next store has same s_dest
      2. call
      3. end of the block
    */
    std::map<mir::types::LabelId, mir::inst::BasicBlk>::iterator bit;
    std::map<mir::inst::VarId, mir::inst::VarId> reg_load;
    for (bit = func.basic_blks.begin(); bit != func.basic_blks.end(); bit++) {
      auto& bb = bit->second;
      // calculate call num
      int index = 0;
      std::vector<int> call_index;
      call_index.push_back(0);
      for (auto& inst : bb.inst) {
        auto& i = *inst;
        if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
          auto find = unaffected_call.find(x->func);
          if (find == unaffected_call.end()) {
            call_index.push_back(index + 1);
          }
        }
        if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
          call_index.push_back(index);
        }
        index++;
      }
      std::vector<int> del_index;
      for (int j = 0; j < call_index.size(); j++) {
        int upper_bound =
            (j == (call_index.size() - 1)) ? bb.inst.size() : call_index[j + 1];
        std::map<mir::inst::VarId, std::variant<int32_t, mir::inst::VarId>>
            store;
        std::map<mir::inst::VarId, std::variant<int32_t, mir::inst::VarId>>
            load;
        std::map<mir::inst::VarId,
                 std::variant<int32_t, mir::inst::VarId>>::iterator it;
        index = 0;
        for (auto& inst : bb.inst) {
          if (index >= call_index[j] && index < upper_bound) {
            auto& i = *inst;
            if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
              std::variant<int32_t, mir::inst::VarId> value;
              if (x->val.index() == 1) {
                value.emplace<1>(std::get<1>(x->val));
              } else {
                value.emplace<0>(std::get<0>(x->val));
              }
              it = store.find(x->dest);
              if (it == store.end()) {
                store.insert(std::map<mir::inst::VarId,
                                      std::variant<int32_t, mir::inst::VarId>>::
                                 value_type(x->dest, value));
              } else {
                store[x->dest] = value;
              }
            } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
              if (x->src.index() == 1) {
                it = store.find(std::get<1>(x->src));
                if (it != store.end()) {
                  std::map<mir::inst::VarId,
                           std::variant<int32_t, mir::inst::VarId>>::iterator
                      iter;
                  iter = load.find(x->dest);
                  if (iter == load.end()) {
                    load.insert(
                        std::map<mir::inst::VarId,
                                 std::variant<int32_t, mir::inst::VarId>>::
                            value_type(x->dest, it->second));
                    if (it->second.index() == 1) {
                      reg_load.insert(
                          std::map<mir::inst::VarId, mir::inst::VarId>::
                              value_type(x->dest, std::get<1>(it->second)));
                    }
                  } else {
                    load[x->dest] = it->second;
                  }
                  if (it->second.index() == 1) {
                    del_index.push_back(index);
                  }
                } else {
                  std::variant<int32_t, mir::inst::VarId> value;
                  value.emplace<1>(x->dest);
                  if (x->src.index() == 1) {
                    store.insert(
                        std::map<mir::inst::VarId,
                                 std::variant<int32_t, mir::inst::VarId>>::
                            value_type(std::get<1>(x->src), value));
                  }
                }
              }
            }
          }
          index++;
        }
        for (it = load.begin(); it != load.end(); it++) {
          std::map<mir::inst::VarId,
                   std::variant<int32_t, mir::inst::VarId>>::iterator iet;
          for (iet = load.begin(); iet != load.end(); iet++) {
            if (iet->second.index() == 1 &&
                it->first == std::get<1>(iet->second)) {
              load[iet->first] = it->second;
            }
          }
        }
        // replace
        index = 0;
        for (auto& inst : bb.inst) {
          if (index >= call_index[j] && index < upper_bound) {
            auto& i = *inst;
            if (auto x = dynamic_cast<mir::inst::AssignInst*>(&i)) {
              if (x->src.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->src));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->src.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->src.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
              for (int j = 0; j < x->params.size(); j++) {
                if (x->params[j].index() == 1) {
                  std::map<mir::inst::VarId,
                           std::variant<int32_t, mir::inst::VarId>>::iterator
                      lit = load.find(std::get<1>(x->params[j]));
                  if (lit != load.end()) {
                    if (lit->second.index() == 0) {
                      x->params[j].emplace<0>(std::get<0>(lit->second));
                    } else {
                      x->params[j].emplace<1>(std::get<1>(lit->second));
                    }
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::OpInst*>(&i)) {
              if (x->lhs.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->lhs));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->lhs.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->lhs.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
              if (x->rhs.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->rhs));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->rhs.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->rhs.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
              if (x->src.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->src));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->src.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->src.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
              if (x->val.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->val));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->val.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->val.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst*>(&i)) {
              if (x->offset.index() == 1) {
                std::map<mir::inst::VarId,
                         std::variant<int32_t, mir::inst::VarId>>::iterator
                    lit = load.find(std::get<1>(x->offset));
                if (lit != load.end()) {
                  if (lit->second.index() == 0) {
                    x->offset.emplace<0>(std::get<0>(lit->second));
                  } else {
                    x->offset.emplace<1>(std::get<1>(lit->second));
                  }
                }
              }
            }
          }
          index++;
        }
      }
      // delete load
      for (int i = del_index.size() - 1; i >= 0; i--) {
        auto iter = bit->second.inst.begin() + del_index[i];
        bit->second.inst.erase(iter);
      }
    }
    std::map<mir::inst::VarId, mir::inst::VarId>::iterator iet;
    for (iet = reg_load.begin(); iet != reg_load.end(); iet++) {
      std::map<mir::inst::VarId, mir::inst::VarId>::iterator iet1;
      for (iet1 = reg_load.begin(); iet1 != reg_load.end(); iet1++) {
        if (iet->first == iet1->second) {
          reg_load[iet1->first] = iet->second;
        }
      }
    }
    for (bit = func.basic_blks.begin(); bit != func.basic_blks.end(); bit++) {
      auto& bb = bit->second;
      for (auto& inst : bb.inst) {
        auto& i = *inst;
        if (auto x = dynamic_cast<mir::inst::AssignInst*>(&i)) {
          if (x->src.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->src));
            if (lit != reg_load.end()) {
              x->src.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::CallInst*>(&i)) {
          for (int j = 0; j < x->params.size(); j++) {
            if (x->params[j].index() == 1) {
              std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                  reg_load.find(std::get<1>(x->params[j]));
              if (lit != reg_load.end()) {
                x->params[j].emplace<1>(lit->second);
              }
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::OpInst*>(&i)) {
          if (x->lhs.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->lhs));
            if (lit != reg_load.end()) {
              x->lhs.emplace<1>(lit->second);
            }
          }
          if (x->rhs.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->rhs));
            if (lit != reg_load.end()) {
              x->rhs.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::LoadInst*>(&i)) {
          if (x->src.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->src));
            if (lit != reg_load.end()) {
              x->src.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::StoreInst*>(&i)) {
          if (x->val.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->val));
            if (lit != reg_load.end()) {
              x->val.emplace<1>(lit->second);
            }
          }
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst*>(&i)) {
          if (x->offset.index() == 1) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(std::get<1>(x->offset));
            if (lit != reg_load.end()) {
              x->offset.emplace<1>(lit->second);
            }
          }
          std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
              reg_load.find(x->ptr);
          if (lit != reg_load.end()) {
            x->ptr = lit->second;
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst*>(&i)) {
          for (int j = 0; j < x->vars.size(); j++) {
            std::map<mir::inst::VarId, mir::inst::VarId>::iterator lit =
                reg_load.find(x->vars[j]);
            if (lit != reg_load.end()) {
              x->vars[j] = lit->second;
            }
          }
        }
      }
    }
  }